

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

string * __thiscall
google::protobuf::FieldDescriptor::DefaultValueAsString_abi_cxx11_
          (FieldDescriptor *this,bool quote_string_type)

{
  bool bVar1;
  CppType CVar2;
  Type TVar3;
  char *pcVar4;
  string *psVar5;
  EnumValueDescriptor *this_00;
  AlphaNum *a;
  byte in_DL;
  FieldDescriptor *in_RSI;
  string *in_RDI;
  LogMessage *in_stack_fffffffffffffd98;
  allocator *paVar6;
  LogMessage *in_stack_fffffffffffffda0;
  LogMessage *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda8;
  LogMessage *in_stack_fffffffffffffdb0;
  string *in_stack_fffffffffffffdc8;
  undefined8 in_stack_fffffffffffffde8;
  float value;
  string *this_02;
  allocator local_1ea [2];
  LogMessage local_1e8;
  LogMessage local_1a8;
  string local_170 [32];
  string local_150 [39];
  allocator local_129 [216];
  byte local_51;
  undefined1 local_50 [63];
  byte local_11;
  
  value = (float)((ulong)in_stack_fffffffffffffde8 >> 0x20);
  local_11 = in_DL & 1;
  this_02 = in_RDI;
  bVar1 = has_default_value(in_RSI);
  local_51 = 0;
  if (!bVar1) {
    value = (float)((ulong)local_50 >> 0x20);
    internal::LogMessage::LogMessage
              (in_stack_fffffffffffffdb0,
               (LogLevel_conflict)((ulong)in_stack_fffffffffffffda8 >> 0x20),
               (char *)in_stack_fffffffffffffda0,(int)((ulong)in_stack_fffffffffffffd98 >> 0x20));
    local_51 = 1;
    internal::LogMessage::operator<<(in_stack_fffffffffffffda0,(char *)in_stack_fffffffffffffd98);
    internal::LogMessage::operator<<(in_stack_fffffffffffffda0,(char *)in_stack_fffffffffffffd98);
    internal::LogFinisher::operator=
              ((LogFinisher *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage((LogMessage *)0x4a4bdb);
  }
  CVar2 = cpp_type((FieldDescriptor *)0x4a4be5);
  a = (AlphaNum *)(ulong)(CVar2 - CPPTYPE_INT32);
  switch(a) {
  case (AlphaNum *)0x0:
    default_value_int32(in_RSI);
    strings::AlphaNum::AlphaNum
              ((AlphaNum *)in_stack_fffffffffffffda0,(int)((ulong)in_stack_fffffffffffffd98 >> 0x20)
              );
    StrCat_abi_cxx11_(a);
    break;
  case (AlphaNum *)0x1:
    default_value_int64(in_RSI);
    strings::AlphaNum::AlphaNum
              ((AlphaNum *)in_stack_fffffffffffffda0,(long)in_stack_fffffffffffffd98);
    StrCat_abi_cxx11_(a);
    break;
  case (AlphaNum *)0x2:
    default_value_uint32(in_RSI);
    strings::AlphaNum::AlphaNum
              ((AlphaNum *)in_stack_fffffffffffffda0,
               (uint)((ulong)in_stack_fffffffffffffd98 >> 0x20));
    StrCat_abi_cxx11_(a);
    break;
  case (AlphaNum *)0x3:
    default_value_uint64(in_RSI);
    strings::AlphaNum::AlphaNum
              ((AlphaNum *)in_stack_fffffffffffffda0,(unsigned_long)in_stack_fffffffffffffd98);
    StrCat_abi_cxx11_(a);
    break;
  case (AlphaNum *)0x4:
    default_value_double(in_RSI);
    SimpleDtoa_abi_cxx11_((double)this_02);
    break;
  case (AlphaNum *)0x5:
    default_value_float(in_RSI);
    SimpleFtoa_abi_cxx11_(value);
    break;
  case (AlphaNum *)0x6:
    bVar1 = default_value_bool(in_RSI);
    pcVar4 = "false";
    if (bVar1) {
      pcVar4 = "true";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this_02,pcVar4,local_129);
    std::allocator<char>::~allocator((allocator<char> *)local_129);
    break;
  case (AlphaNum *)0x7:
    this_00 = default_value_enum((FieldDescriptor *)in_stack_fffffffffffffda0);
    psVar5 = EnumValueDescriptor::name_abi_cxx11_(this_00);
    std::__cxx11::string::string((string *)this_02,(string *)psVar5);
    break;
  case (AlphaNum *)0x8:
    if ((local_11 & 1) == 0) {
      TVar3 = type((FieldDescriptor *)in_stack_fffffffffffffdb0);
      if (TVar3 == TYPE_BYTES) {
        default_value_string_abi_cxx11_(in_RSI);
        CEscape(in_stack_fffffffffffffdc8);
      }
      else {
        psVar5 = default_value_string_abi_cxx11_(in_RSI);
        std::__cxx11::string::string((string *)this_02,(string *)psVar5);
      }
    }
    else {
      default_value_string_abi_cxx11_(in_RSI);
      CEscape(in_stack_fffffffffffffdc8);
      std::operator+((char *)in_stack_fffffffffffffda8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffda0);
      std::operator+(in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0);
      std::__cxx11::string::~string(local_150);
      std::__cxx11::string::~string(local_170);
    }
    break;
  case (AlphaNum *)0x9:
    in_stack_fffffffffffffdb0 = &local_1a8;
    internal::LogMessage::LogMessage
              (in_stack_fffffffffffffdb0,
               (LogLevel_conflict)((ulong)in_stack_fffffffffffffda8 >> 0x20),
               (char *)in_stack_fffffffffffffda0,(int)((ulong)in_stack_fffffffffffffd98 >> 0x20));
    internal::LogMessage::operator<<(in_stack_fffffffffffffda0,(char *)in_stack_fffffffffffffd98);
    internal::LogFinisher::operator=
              ((LogFinisher *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    internal::LogMessage::~LogMessage((LogMessage *)0x4a4f49);
  default:
    this_01 = &local_1e8;
    internal::LogMessage::LogMessage
              (in_stack_fffffffffffffdb0,
               (LogLevel_conflict)((ulong)in_stack_fffffffffffffda8 >> 0x20),(char *)this_01,
               (int)((ulong)in_stack_fffffffffffffd98 >> 0x20));
    internal::LogMessage::operator<<(this_01,(char *)in_stack_fffffffffffffd98);
    internal::LogFinisher::operator=((LogFinisher *)this_01,in_stack_fffffffffffffd98);
    internal::LogMessage::~LogMessage((LogMessage *)0x4a4fca);
    paVar6 = local_1ea;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this_02,anon_var_dwarf_29dbec + 0x11,paVar6);
    std::allocator<char>::~allocator((allocator<char> *)local_1ea);
  }
  return in_RDI;
}

Assistant:

std::string FieldDescriptor::DefaultValueAsString(
    bool quote_string_type) const {
  GOOGLE_CHECK(has_default_value()) << "No default value";
  switch (cpp_type()) {
    case CPPTYPE_INT32:
      return StrCat(default_value_int32());
      break;
    case CPPTYPE_INT64:
      return StrCat(default_value_int64());
      break;
    case CPPTYPE_UINT32:
      return StrCat(default_value_uint32());
      break;
    case CPPTYPE_UINT64:
      return StrCat(default_value_uint64());
      break;
    case CPPTYPE_FLOAT:
      return SimpleFtoa(default_value_float());
      break;
    case CPPTYPE_DOUBLE:
      return SimpleDtoa(default_value_double());
      break;
    case CPPTYPE_BOOL:
      return default_value_bool() ? "true" : "false";
      break;
    case CPPTYPE_STRING:
      if (quote_string_type) {
        return "\"" + CEscape(default_value_string()) + "\"";
      } else {
        if (type() == TYPE_BYTES) {
          return CEscape(default_value_string());
        } else {
          return default_value_string();
        }
      }
      break;
    case CPPTYPE_ENUM:
      return default_value_enum()->name();
      break;
    case CPPTYPE_MESSAGE:
      GOOGLE_LOG(DFATAL) << "Messages can't have default values!";
      break;
  }
  GOOGLE_LOG(FATAL) << "Can't get here: failed to get default value as string";
  return "";
}